

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::writeMatrixConstructor<4,2>
               (ostream *str,Matrix<float,_2,_4> *m)

{
  byte bVar1;
  Matrix<float,_2,_4> *pMVar2;
  bool bVar3;
  ostream *this;
  int precision;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  string local_58;
  Matrix<float,_2,_4> *local_38;
  
  local_38 = m;
  std::__ostream_insert<char,std::char_traits<char>>(str,"mat",3);
  this = (ostream *)std::ostream::operator<<(str,4);
  std::__ostream_insert<char,std::char_traits<char>>(this,"x",1);
  std::ostream::operator<<(this,2);
  std::__ostream_insert<char,std::char_traits<char>>(str,"(",1);
  lVar5 = 0;
  uVar4 = extraout_RDX;
  do {
    pMVar2 = local_38;
    bVar1 = 0;
    lVar6 = 0;
    bVar3 = true;
    do {
      bVar7 = bVar3;
      precision = (int)uVar4;
      if (!(bool)(lVar5 == 0 & (bVar1 ^ 1))) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
        precision = extraout_EDX;
      }
      de::floatToString_abi_cxx11_
                (&local_58,(de *)&DAT_00000001,(pMVar2->m_data).m_data[lVar5].m_data[lVar6],
                 precision);
      std::__ostream_insert<char,std::char_traits<char>>
                (str,local_58._M_dataplus._M_p,local_58._M_string_length);
      uVar4 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        uVar4 = extraout_RDX_01;
      }
      lVar6 = 1;
      bVar1 = 1;
      bVar3 = false;
    } while (bVar7);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  std::__ostream_insert<char,std::char_traits<char>>(str,")",1);
  return;
}

Assistant:

void writeMatrixConstructor (std::ostream& str, const tcu::Matrix<float, Rows, Cols>& m)
{
	if (Rows == Cols)
		str << "mat" << Cols;
	else
		str << "mat" << Cols << "x" << Rows;

	str << "(";
	for (int colNdx = 0; colNdx < Cols; colNdx++)
	{
		for (int rowNdx = 0; rowNdx < Rows; rowNdx++)
		{
			if (rowNdx > 0 || colNdx > 0)
				str << ", ";
			str << de::floatToString(m(rowNdx, colNdx), 1);
		}
	}
	str << ")";
}